

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isImage(QPDFObjectHandle *this,bool exclude_imagemask)

{
  bool bVar1;
  bool local_14a;
  byte local_13b;
  byte local_13a;
  bool local_11a;
  allocator<char> local_119;
  string local_118 [39];
  byte local_f1;
  string local_f0;
  byte local_cc;
  byte local_cb;
  byte local_ca;
  allocator<char> local_c9;
  string local_c8 [39];
  byte local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  QPDFObjectHandle *pQStack_18;
  bool exclude_imagemask_local;
  QPDFObjectHandle *this_local;
  
  local_19 = exclude_imagemask;
  pQStack_18 = this;
  std::allocator<char>::allocator();
  local_a1 = 0;
  local_ca = 0;
  local_cb = 0;
  local_cc = 0;
  local_f1 = 0;
  local_11a = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/Image",&local_79);
  bVar1 = isStreamOfType(this,&local_40,&local_78);
  local_13a = 0;
  if (bVar1) {
    local_13b = 1;
    if ((local_19 & 1) != 0) {
      getDict((QPDFObjectHandle *)&local_a0);
      local_a1 = 1;
      std::allocator<char>::allocator();
      local_ca = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_c8,"/ImageMask",&local_c9);
      local_cb = 1;
      getKey((QPDFObjectHandle *)&local_a0.field_2,&local_a0);
      local_cc = 1;
      local_11a = isBool((QPDFObjectHandle *)&local_a0.field_2);
      local_14a = false;
      if (local_11a) {
        getDict((QPDFObjectHandle *)&local_f0);
        local_f1 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_118,"/ImageMask",&local_119);
        getKey((QPDFObjectHandle *)&local_f0.field_2,&local_f0);
        local_14a = getBoolValue((QPDFObjectHandle *)&local_f0.field_2);
      }
      local_13b = local_14a ^ 0xff;
    }
    local_13a = local_13b;
  }
  this_local._7_1_ = local_13a & 1;
  if (local_11a != false) {
    ~QPDFObjectHandle((QPDFObjectHandle *)&local_f0.field_2);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  if ((local_f1 & 1) != 0) {
    ~QPDFObjectHandle((QPDFObjectHandle *)&local_f0);
  }
  if ((local_cc & 1) != 0) {
    ~QPDFObjectHandle((QPDFObjectHandle *)&local_a0.field_2);
  }
  if ((local_cb & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  if ((local_ca & 1) != 0) {
    std::allocator<char>::~allocator(&local_c9);
  }
  if ((local_a1 & 1) != 0) {
    ~QPDFObjectHandle((QPDFObjectHandle *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isImage(bool exclude_imagemask) const
{
    return (
        isStreamOfType("", "/Image") &&
        ((!exclude_imagemask) ||
         (!(getDict().getKey("/ImageMask").isBool() &&
            getDict().getKey("/ImageMask").getBoolValue()))));
}